

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translucent_shader.cpp
# Opt level: O0

void gen_translucent_shade
               (float *ca,float *cr,float *cl,float *cp,float *l,float *e,float *norm,float p,
               float x,float y,float ds,float dd,float depth,float *c)

{
  float fVar1;
  double dVar2;
  float local_9c [2];
  vec3 ci;
  vec3 vthird;
  vec3 vsec;
  vec3 vrot;
  float i;
  vec3 vbase;
  vec3 ci_total;
  float depth_local;
  float dd_local;
  float ds_local;
  float y_local;
  float x_local;
  float p_local;
  float *e_local;
  float *l_local;
  float *cp_local;
  float *cl_local;
  float *cr_local;
  float *ca_local;
  
  gen_lambert_shade(ca,cr,cl,norm,l,c);
  gen_phong_shade(cl,cp,l,e,norm,(int)p,c);
  vec3_scale(c,c,dd);
  memset(vbase + 1,0,0xc);
  vrot[2] = *norm - ds;
  vbase[0] = norm[2];
  vec3_norm(vrot + 2,vrot + 2);
  for (vrot[1] = 0.0; vrot[1] < 6.2831855; vrot[1] = vrot[1] + 1.0) {
    vec3_mul_cross(vsec + 1,norm,vrot + 2);
    dVar2 = std::sin((double)(ulong)(uint)vrot[1]);
    vec3_scale(vsec + 1,vsec + 1,SUB84(dVar2,0));
    dVar2 = std::cos((double)(ulong)(uint)vrot[1]);
    vec3_scale(vthird + 1,vrot + 2,SUB84(dVar2,0));
    fVar1 = vec3_mul_inner(norm,vrot + 2);
    dVar2 = std::cos((double)(ulong)(uint)vrot[1]);
    vec3_scale(ci + 1,norm,fVar1 * (1.0 - SUB84(dVar2,0)));
    vec3_add(vsec + 1,vsec + 1,vthird + 1);
    vec3_add(vsec + 1,vsec + 1,ci + 1);
    gen_lambert_shade(ca,cr,cl,norm,vsec + 1,local_9c);
    gen_phong_shade(cl,cp,vsec + 1,e,norm,(int)p,local_9c);
    vec3_add(vbase + 1,vbase + 1,local_9c);
  }
  vec3_scale(vbase + 1,vbase + 1,1.0 - dd);
  vec3_add(c,c,vbase + 1);
  return;
}

Assistant:

void gen_translucent_shade(const vec3 ca, const vec3 cr, const vec3 cl, const vec3 cp, vec3 l, const vec3 e, const vec3 norm, const float p,
float x, float y, const float ds, const float dd, const float depth, vec3 c){
    //cal diffuse and spec for inner and outer layer and blend
    gen_lambert_shade(ca, cr, cl, norm, l, c);
    gen_phong_shade(cl, cp, l, e, norm, p, c);
    vec3_scale(c, c, dd); //scale outer color by dimming with depth decay factor
    //apply BTDF to simulate a sum of subsurface source (a forward dipole)
    vec3 ci_total = {0.0f, 0.0f, 0.0f};

    vec3 vbase = {norm[0] - ds, norm[1] - depth, norm[2]}; //pick a subsurface source to start with, set our microfacet dipole to be ds unit away
    vec3_norm(vbase, vbase);
    //approximate an intergral of these subsurface sources
    for(float i = 0.0f; i < 2*PI; i+=1.0f){
        //find rotated vector around the normal by Rodrigue's rotation formula
        vec3 vrot;
        //first term
        vec3_mul_cross(vrot, norm, vbase);
        vec3_scale(vrot, vrot, sin(i));
        //second term
        vec3 vsec;
        vec3_scale(vsec, vbase, cos(i));
        //third term
        vec3 vthird;
        vec3_scale(vthird, norm, vec3_mul_inner(norm, vbase) * (1 - cos(i)) );
        //add and find rotated vec
        vec3_add(vrot, vrot, vsec);
        vec3_add(vrot, vrot, vthird);

        //calculate BTDF for this derivative
        vec3 ci;
        gen_lambert_shade(ca, cr, cl, norm, vrot, ci);
        gen_phong_shade(cl, cp, vrot, e, norm, p, ci);
        vec3_add(ci_total, ci_total, ci);
    }

    vec3_scale(ci_total, ci_total, 1 - dd); //preserve energy by culling with depth decay

    //composite
    vec3_add(c, c, ci_total);
}